

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O3

void __thiscall
OpenMD::EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(EqualIgnoreCaseConstraint *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->rhs_)._M_dataplus._M_p;
  paVar2 = &(this->rhs_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>).description_.
           _M_dataplus._M_p;
  paVar2 = &(this->super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>).description_.
            field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

EqualIgnoreCaseConstraint(std::string rhs) :
        rhs_(OpenMD::toUpperCopy(rhs)) {
      std::stringstream iss;
      iss << "equal to (case insensitive) " << rhs;
      this->description_ = iss.str();
    }